

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hal_h265e_vepu580.c
# Opt level: O1

void save_to_file(char *name,void *ptr,size_t size)

{
  FILE *__s;
  
  __s = fopen(name,"w+b");
  if (__s != (FILE *)0x0) {
    fwrite(ptr,1,size,__s);
    fclose(__s);
    return;
  }
  _mpp_log_l(2,"hal_h265e_v580","create file %s failed\n",(char *)0x0,name);
  return;
}

Assistant:

void save_to_file(char *name, void *ptr, size_t size)
{
    FILE *fp = fopen(name, "w+b");
    if (fp) {
        fwrite(ptr, 1, size, fp);
        fclose(fp);
    } else
        mpp_err("create file %s failed\n", name);
}